

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

char * mp_encode_int(char *data,int64_t num)

{
  long lVar1;
  uint uVar2;
  
  if (num < 0) {
    if (num < -0x20) {
      if (num < -0x80) {
        if (num < -0x8000) {
          if (num < -0x80000000) {
            *data = -0x2d;
            *(ulong *)(data + 1) =
                 (ulong)num >> 0x38 | (num & 0xff000000000000U) >> 0x28 |
                 (num & 0xff0000000000U) >> 0x18 | (num & 0xff00000000U) >> 8 |
                 (num & 0xff000000U) << 8 | (num & 0xff0000U) << 0x18 | (num & 0xff00U) << 0x28 |
                 num << 0x38;
            lVar1 = 9;
          }
          else {
            *data = -0x2e;
            uVar2 = (uint)num;
            *(uint *)(data + 1) =
                 uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
            lVar1 = 5;
          }
        }
        else {
          *data = -0x2f;
          *(ushort *)(data + 1) = (ushort)num << 8 | (ushort)num >> 8;
          lVar1 = 3;
        }
      }
      else {
        *data = -0x30;
        data[1] = (byte)num;
        lVar1 = 2;
      }
    }
    else {
      *data = (byte)num | 0xe0;
      lVar1 = 1;
    }
    return data + lVar1;
  }
  __assert_fail("num < 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h",
                0x8cc,"char *mp_encode_int(char *, int64_t)");
}

Assistant:

MP_IMPL char *
mp_encode_int(char *data, int64_t num)
{
	assert(num < 0);
	if (num >= -0x20) {
		return mp_store_u8(data, (uint8_t)(0xe0 | num));
	} else if (num >= INT8_MIN) {
		data = mp_store_u8(data, 0xd0);
		return mp_store_u8(data, (uint8_t)num);
	} else if (num >= INT16_MIN) {
		data = mp_store_u8(data, 0xd1);
		return mp_store_u16(data, (uint16_t)num);
	} else if (num >= INT32_MIN) {
		data = mp_store_u8(data, 0xd2);
		return mp_store_u32(data, (uint32_t)num);
	} else {
		data = mp_store_u8(data, 0xd3);
		return mp_store_u64(data, num);
	}
}